

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O2

DdApaDigit Cudd_ApaSubtract(int digits,DdApaNumber a,DdApaNumber b,DdApaNumber diff)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0x100000000;
  for (uVar1 = (ulong)(uint)digits; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
    uVar2 = ((ulong)a[uVar1 - 1] + (uVar2 >> 0x20) + 0xffffffff) - (ulong)b[uVar1 - 1];
    diff[uVar1 - 1] = (DdApaDigit)uVar2;
  }
  return (int)(uVar2 >> 0x20) - 1;
}

Assistant:

DdApaDigit
Cudd_ApaSubtract(
  int  digits,
  DdApaNumber  a,
  DdApaNumber  b,
  DdApaNumber  diff)
{
    int i;
    DdApaDoubleDigit partial = DD_APA_BASE;

    for (i = digits - 1; i >= 0; i--) {
        partial = DD_MSDIGIT(partial) + DD_APA_MASK + a[i] - b[i];
        diff[i] = (DdApaDigit) DD_LSDIGIT(partial);
    }
    return((DdApaDigit) DD_MSDIGIT(partial) - 1);

}